

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

bool __thiscall FConfigFile::DeleteCurrentSection(FConfigFile *this)

{
  FConfigSection *this_00;
  bool bVar1;
  FConfigSection *local_20;
  FConfigSection *sec;
  FConfigFile *this_local;
  
  if (this->CurrentSection == (FConfigSection *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ClearCurrentSection(this);
    local_20 = this->Sections;
    while( true ) {
      bVar1 = false;
      if (local_20 != (FConfigSection *)0x0) {
        bVar1 = local_20->Next != this->CurrentSection;
      }
      if (!bVar1) break;
      local_20 = local_20->Next;
    }
    local_20->Next = this->CurrentSection->Next;
    if (this->LastSectionPtr == &this->CurrentSection->Next) {
      this->LastSectionPtr = &local_20->Next;
    }
    this_00 = this->CurrentSection;
    if (this_00 != (FConfigSection *)0x0) {
      FConfigSection::~FConfigSection(this_00);
      operator_delete(this_00,0x28);
    }
    this->CurrentSection = local_20->Next;
    this_local._7_1_ = this->CurrentSection != (FConfigSection *)0x0;
  }
  return this_local._7_1_;
}

Assistant:

bool FConfigFile::DeleteCurrentSection()
{
	if (CurrentSection != NULL)
	{
		FConfigSection *sec;

		ClearCurrentSection();

		// Find the preceding section.
		for (sec = Sections; sec != NULL && sec->Next != CurrentSection; sec = sec->Next)
		{ }

		sec->Next = CurrentSection->Next;
		if (LastSectionPtr == &CurrentSection->Next)
		{
			LastSectionPtr = &sec->Next;
		}

		delete CurrentSection;

		CurrentSection = sec->Next;
		return CurrentSection != NULL;
	}
	return false;
}